

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O1

void __thiscall UnitTest_lex7::Run(UnitTest_lex7 *this)

{
  CharInStream *pCVar1;
  int iVar2;
  int iVar3;
  char *__end;
  LexerWrapper lexer;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_188;
  undefined8 uStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  LexerWrapper local_160;
  
  local_188.str_ = (String *)&local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"_ __ ___ _1 _a _a1 a1 a_ a_1 name","");
  anon_unknown.dwarf_3ac4::LexerWrapper::LexerWrapper(&local_160,(string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.str_ != &local_178) {
    operator_delete(local_188.str_);
  }
  iVar3 = 10;
  do {
    local_188.number_ = 0.0;
    uStack_180 = 0;
    local_178._M_allocated_capacity = 0;
    local_178._8_4_ = 0x11e;
    iVar2 = luna::Lexer::GetToken(&local_160.lexer_,(TokenDetail *)&local_188);
    if (iVar2 != 0x115) {
      local_188.str_ = (String *)&local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,"\'lexer.GetToken() == luna::Token_Id\'","");
      UnitTestBase::Error(&this->super_UnitTestBase,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.str_ != &local_178) {
        operator_delete(local_188.str_);
      }
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_188.number_ = 0.0;
  uStack_180 = 0;
  local_178._M_allocated_capacity = 0;
  local_178._8_4_ = 0x11e;
  iVar3 = luna::Lexer::GetToken(&local_160.lexer_,(TokenDetail *)&local_188);
  if (iVar3 != 0x11e) {
    local_188.str_ = (String *)&local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"\'lexer.GetToken() == luna::Token_EOF\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.str_ != &local_178) {
      operator_delete(local_188.str_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.lexer_.token_buffer_._M_dataplus._M_p != &local_160.lexer_.token_buffer_.field_2)
  {
    operator_delete(local_160.lexer_.token_buffer_._M_dataplus._M_p);
  }
  if (local_160.lexer_.in_stream_.super__Function_base._M_manager != (_Manager_type)0x0) {
    pCVar1 = &local_160.lexer_.in_stream_;
    (*local_160.lexer_.in_stream_.super__Function_base._M_manager)
              ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
  }
  luna::String::~String(&local_160.name_);
  luna::State::~State(&local_160.state_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.iss_.str_._M_dataplus._M_p != &local_160.iss_.str_.field_2) {
    operator_delete(local_160.iss_.str_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_CASE(lex7)
{
    LexerWrapper lexer("_ __ ___ _1 _a _a1 a1 a_ a_1 name");
    for (int i = 0; i < 10; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_Id);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}